

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile-iosim.c
# Opt level: O0

void info(char *fmt,...)

{
  double dVar1;
  long lVar2;
  char *__s;
  char in_AL;
  size_t sVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_100;
  char acStack_f8 [8];
  char *local_f0;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined4 local_38;
  undefined4 local_34;
  va_list va;
  char *buf;
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  uStack_100 = 0x10392b;
  local_e0 = in_RSI;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  MPI_Barrier(&ompi_mpi_comm_world);
  if (info::t0 < 0.0) {
    uStack_100 = 0x10393d;
    info::t0 = (double)MPI_Wtime();
  }
  uStack_100 = 0x10394e;
  sVar3 = strlen(fmt);
  lVar2 = -(sVar3 + 0x73 & 0xfffffffffffffff0);
  local_f0 = acStack_f8 + lVar2;
  *(undefined8 *)((long)&uStack_100 + lVar2) = 0x103976;
  dVar1 = (double)MPI_Wtime();
  __s = local_f0;
  *(undefined8 *)((long)&uStack_100 + lVar2) = 0x103997;
  sprintf(__s,"[%010.3f] %s",SUB84(dVar1 - info::t0,0),fmt);
  if (ThisTask == 0) {
    va[0].overflow_arg_area = local_e8;
    va[0]._0_8_ = &stack0x00000008;
    local_34 = 0x30;
    local_38 = 8;
    *(undefined8 *)((long)&uStack_100 + lVar2) = 0x1039d1;
    vprintf(acStack_f8 + lVar2,&local_38);
  }
  return;
}

Assistant:

static void 
info(char * fmt, ...) {

    static double t0 = -1.0;

    MPI_Barrier(MPI_COMM_WORLD);

    if(t0 < 0) t0 = MPI_Wtime();

    char * buf = alloca(strlen(fmt) + 100);
    sprintf(buf, "[%010.3f] %s", MPI_Wtime() - t0, fmt );

    if(ThisTask == 0) {
        va_list va;
        va_start(va, fmt);
        vprintf(buf, va);
        va_end(va);
    }
}